

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UCharCharacterIterator::move(UCharCharacterIterator *this,int32_t delta,EOrigin origin)

{
  EOrigin origin_local;
  int32_t delta_local;
  UCharCharacterIterator *this_local;
  
  if (origin == kStart) {
    (this->super_CharacterIterator).pos = (this->super_CharacterIterator).begin + delta;
  }
  else if (origin == kCurrent) {
    (this->super_CharacterIterator).pos = delta + (this->super_CharacterIterator).pos;
  }
  else if (origin == kEnd) {
    (this->super_CharacterIterator).pos = (this->super_CharacterIterator).end + delta;
  }
  if ((this->super_CharacterIterator).pos < (this->super_CharacterIterator).begin) {
    (this->super_CharacterIterator).pos = (this->super_CharacterIterator).begin;
  }
  else if ((this->super_CharacterIterator).end < (this->super_CharacterIterator).pos) {
    (this->super_CharacterIterator).pos = (this->super_CharacterIterator).end;
  }
  return (this->super_CharacterIterator).pos;
}

Assistant:

int32_t
UCharCharacterIterator::move(int32_t delta, CharacterIterator::EOrigin origin) {
    switch(origin) {
    case kStart:
        pos = begin + delta;
        break;
    case kCurrent:
        pos += delta;
        break;
    case kEnd:
        pos = end + delta;
        break;
    default:
        break;
    }

    if(pos < begin) {
        pos = begin;
    } else if(pos > end) {
        pos = end;
    }

    return pos;
}